

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper-inl.h
# Opt level: O3

int __thiscall spdlog::details::file_helper::open(file_helper *this,char *__file,int __oflag,...)

{
  filename_t *pfVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  int extraout_EAX;
  int iVar4;
  undefined7 extraout_var;
  long *plVar5;
  int *piVar6;
  size_type *psVar7;
  int iVar8;
  FILE *tmp;
  filename_t local_a8;
  int local_84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  FILE **local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_84 = __oflag;
  close(this,(int)__file);
  pfVar1 = &this->filename_;
  std::__cxx11::string::_M_assign((string *)pfVar1);
  if ((this->event_handlers_).before_open.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->event_handlers_).before_open._M_invoker)((_Any_data *)&this->event_handlers_,pfVar1);
  }
  paVar2 = &local_a8.field_2;
  local_80 = pfVar1;
  if (0 < this->open_tries_) {
    local_78 = &this->fd_;
    iVar8 = 0;
    do {
      os::dir_name(&local_a8,(filename_t *)__file);
      os::create_dir(&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if ((char)local_84 == '\0') {
LAB_0016b0c6:
        local_a8._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"ab","");
        bVar3 = os::fopen_s(local_78,(filename_t *)__file,&local_a8);
        iVar4 = (int)CONCAT71(extraout_var,bVar3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != paVar2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          iVar4 = extraout_EAX;
        }
        if (!bVar3) {
          if ((this->event_handlers_).after_open.super__Function_base._M_manager !=
              (_Manager_type)0x0) {
            local_a8._M_dataplus._M_p = (pointer)this->fd_;
            iVar4 = (*(this->event_handlers_).after_open._M_invoker)
                              ((_Any_data *)&(this->event_handlers_).after_open,local_80,
                               (_IO_FILE **)&local_a8);
          }
          return iVar4;
        }
        os::sleep_for_millis(this->open_interval_);
      }
      else {
        local_a8._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"wb","");
        bVar3 = os::fopen_s((FILE **)&local_70,(filename_t *)__file,&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != paVar2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if (!bVar3) {
          fclose((FILE *)local_70._M_dataplus._M_p);
          goto LAB_0016b0c6;
        }
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 < this->open_tries_);
  }
  os::filename_to_str(&local_50,local_80);
  std::operator+(&local_70,"Failed opening file ",&local_50);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_a8._M_dataplus._M_p = (pointer)*plVar5;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_a8._M_dataplus._M_p == psVar7) {
    local_a8.field_2._M_allocated_capacity = *psVar7;
    local_a8.field_2._8_8_ = plVar5[3];
    local_a8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_a8.field_2._M_allocated_capacity = *psVar7;
  }
  local_a8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  piVar6 = __errno_location();
  throw_spdlog_ex(&local_a8,*piVar6);
}

Assistant:

SPDLOG_INLINE void file_helper::open(const filename_t &fname, bool truncate)
{
    close();
    filename_ = fname;

    auto *mode = SPDLOG_FILENAME_T("ab");
    auto *trunc_mode = SPDLOG_FILENAME_T("wb");

    if (event_handlers_.before_open)
    {
        event_handlers_.before_open(filename_);
    }
    for (int tries = 0; tries < open_tries_; ++tries)
    {
        // create containing folder if not exists already.
        os::create_dir(os::dir_name(fname));
        if (truncate)
        {
            // Truncate by opening-and-closing a tmp file in "wb" mode, always
            // opening the actual log-we-write-to in "ab" mode, since that
            // interacts more politely with eternal processes that might
            // rotate/truncate the file underneath us.
            std::FILE *tmp;
            if (os::fopen_s(&tmp, fname, trunc_mode))
            {
                continue;
            }
            std::fclose(tmp);
        }
        if (!os::fopen_s(&fd_, fname, mode))
        {
            if (event_handlers_.after_open)
            {
                event_handlers_.after_open(filename_, fd_);
            }
            return;
        }

        details::os::sleep_for_millis(open_interval_);
    }

    throw_spdlog_ex("Failed opening file " + os::filename_to_str(filename_) + " for writing", errno);
}